

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void __thiscall CS248::DynamicScene::Scene::~Scene(Scene *this)

{
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&(this->spotLightRotationSpeeds_).super__Vector_base<float,_std::allocator<float>_>);
  std::
  _Vector_base<CS248::StaticScene::SpotLight_*,_std::allocator<CS248::StaticScene::SpotLight_*>_>::
  ~_Vector_base(&(this->spotLights_).
                 super__Vector_base<CS248::StaticScene::SpotLight_*,_std::allocator<CS248::StaticScene::SpotLight_*>_>
               );
  std::
  _Vector_base<CS248::StaticScene::PointLight_*,_std::allocator<CS248::StaticScene::PointLight_*>_>
  ::~_Vector_base(&(this->pointLights_).
                   super__Vector_base<CS248::StaticScene::PointLight_*,_std::allocator<CS248::StaticScene::PointLight_*>_>
                 );
  std::
  _Vector_base<CS248::StaticScene::DirectionalLight_*,_std::allocator<CS248::StaticScene::DirectionalLight_*>_>
  ::~_Vector_base(&(this->directionalLights_).
                   super__Vector_base<CS248::StaticScene::DirectionalLight_*,_std::allocator<CS248::StaticScene::DirectionalLight_*>_>
                 );
  std::
  _Rb_tree<CS248::DynamicScene::SceneLight_*,_CS248::DynamicScene::SceneLight_*,_std::_Identity<CS248::DynamicScene::SceneLight_*>,_std::less<CS248::DynamicScene::SceneLight_*>,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  ::~_Rb_tree(&(this->lights_)._M_t);
  std::
  _Rb_tree<CS248::DynamicScene::SceneObject_*,_CS248::DynamicScene::SceneObject_*,_std::_Identity<CS248::DynamicScene::SceneObject_*>,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  ::~_Rb_tree(&(this->objects_)._M_t);
  return;
}

Assistant:

Scene::~Scene() { }